

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O3

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getType_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  
  iVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[6])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[5])();
    __s = "processor";
    if ((char)iVar1 != '\0') {
      __s = "graph";
    }
  }
  else {
    __s = "namespace";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getType() const
{
    return module.isNamespace() ? "namespace"
                                : (module.isGraph() ? "graph" : "processor");
}